

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_GetSetPosition_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  PositionType minPosition;
  PositionType maxPosition;
  bool bVar1;
  char *message;
  long lVar2;
  PositionType position_1;
  PositionType position;
  AssertionResult gtest_ar;
  ParticleType particle;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  double dStack_c0;
  double local_b8;
  AssertHelper local_b0;
  undefined1 *local_a8 [4];
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  Particle local_78;
  
  local_a8[0] = (undefined1 *)0xc024000000000000;
  local_a8[1] = (undefined1 *)0xc024000000000000;
  local_a8[2] = (undefined1 *)0xc024000000000000;
  local_c8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000
  ;
  dStack_c0 = 10.0;
  local_b8 = 10.0;
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  minPosition.z = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  maxPosition.z = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
            (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,minPosition,
             maxPosition);
  local_a8[0] = &DAT_404b1020c49ba5e3;
  local_a8[1] = (undefined1 *)0xc07af5999999999a;
  local_a8[2] = (undefined1 *)0x4041d33333333333;
  local_78.position.z = 35.65;
  local_78.position.x = (double)&DAT_404b1020c49ba5e3;
  local_78.position.y = -431.35;
  lVar2 = 0;
  do {
    local_b8 = local_78.position.z;
    local_c8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_78.position.x;
    dStack_c0 = local_78.position.y;
    testing::internal::CmpHelperEQ<double,double>
              (local_88,"newPosition[d]","particle.getPosition()[d]",
               (double *)((long)local_a8 + lVar2),(double *)((long)&local_c8.ptr_ + lVar2));
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_80.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x7b,message);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (((local_c8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c8.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetPosition)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;

    ParticleType particle = this->randomParticle();
    PositionType newPosition = this->getPosition(54.126, -431.35, 35.65);
    particle.setPosition(newPosition);
    ASSERT_EQ_VECTOR(newPosition, particle.getPosition(), this->dimension);
}